

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecBit.h
# Opt level: O2

Vec_Bit_t * Vec_BitStart(int nSize)

{
  Vec_Bit_t *pVVar1;
  int *__s;
  int iVar2;
  size_t __size;
  
  iVar2 = ((nSize >> 5) + 1) - (uint)((nSize & 0x1fU) == 0);
  pVVar1 = (Vec_Bit_t *)malloc(0x10);
  pVVar1->nCap = iVar2 * 0x20;
  if (iVar2 == 0) {
    __size = 0;
    __s = (int *)0x0;
  }
  else {
    __size = (long)iVar2 << 2;
    __s = (int *)malloc(__size);
  }
  pVVar1->pArray = __s;
  pVVar1->nSize = iVar2 * 0x20;
  memset(__s,0,__size);
  return pVVar1;
}

Assistant:

static inline Vec_Bit_t * Vec_BitStart( int nSize )
{
    Vec_Bit_t * p;
    nSize = (nSize >> 5) + ((nSize & 31) > 0);
    p = Vec_BitAlloc( nSize * 32 );
    p->nSize = nSize * 32;
    memset( p->pArray, 0, sizeof(int) * (size_t)nSize );
    return p;
}